

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DC16NoTop_SSE2(uint8_t *dst)

{
  int DC;
  uint uVar1;
  long lVar2;
  
  uVar1 = 8;
  for (lVar2 = -1; lVar2 != 0x1ff; lVar2 = lVar2 + 0x20) {
    uVar1 = uVar1 + dst[lVar2];
  }
  Put16_SSE2((uint8_t)(uVar1 >> 4),dst);
  return;
}

Assistant:

static void DC16NoTop_SSE2(uint8_t* dst) {  // DC with top samples unavailable
  int DC = 8;
  int j;
  for (j = 0; j < 16; ++j) {
    DC += dst[-1 + j * BPS];
  }
  Put16_SSE2(DC >> 4, dst);
}